

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateHashCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$().getNumber();\n"
  ;
  if (*(char *)(*(long *)((this->super_ImmutableEnumFieldGenerator).descriptor_ + 0x10) + 0x3a) ==
      '\x03') {
    text = 
    "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$Value();\n";
  }
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateHashCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
                   "hash = (37 * hash) + $constant_name$;\n"
                   "hash = (53 * hash) + get$capitalized_name$Value();\n");
  } else {
    printer->Print(
        variables_,
        "hash = (37 * hash) + $constant_name$;\n"
        "hash = (53 * hash) + get$capitalized_name$().getNumber();\n");
  }
}